

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O0

EbmlElement * __thiscall libebml::EbmlMaster::FindElt(EbmlMaster *this,EbmlCallbacks *Callbacks)

{
  EbmlElement *pEVar1;
  bool bVar2;
  int iVar3;
  EbmlElement *pEVar4;
  const_reference ppEVar5;
  undefined4 extraout_var;
  EbmlId local_40;
  value_type local_30;
  EbmlElement *tmp;
  size_t Index;
  EbmlCallbacks *Callbacks_local;
  EbmlMaster *this_local;
  
  tmp = (EbmlElement *)0x0;
  Index = (size_t)Callbacks;
  Callbacks_local = (EbmlCallbacks *)this;
  while( true ) {
    pEVar1 = tmp;
    pEVar4 = (EbmlElement *)
             std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::size
                       (&this->ElementList);
    if (pEVar4 <= pEVar1) {
      return (EbmlElement *)0x0;
    }
    ppEVar5 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::
              operator[](&this->ElementList,(size_type)tmp);
    local_30 = *ppEVar5;
    iVar3 = (*local_30->_vptr_EbmlElement[3])();
    local_40._0_8_ = *(undefined8 *)CONCAT44(extraout_var,iVar3);
    local_40.Length = ((undefined8 *)CONCAT44(extraout_var,iVar3))[1];
    bVar2 = EbmlId::operator==(&local_40,*(EbmlId **)(Index + 8));
    if (bVar2) break;
    tmp = (EbmlElement *)((long)&tmp->_vptr_EbmlElement + 1);
  }
  return local_30;
}

Assistant:

EbmlElement *EbmlMaster::FindElt(const EbmlCallbacks & Callbacks) const
{
  size_t Index;

  for (Index = 0; Index < ElementList.size(); Index++) {
    EbmlElement * tmp = ElementList[Index];
    if (EbmlId(*tmp) == EBML_INFO_ID(Callbacks))
      return tmp;
  }

  return NULL;
}